

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

bool testing::internal::BoolFromGTestEnv(char *flag,bool default_value)

{
  int iVar1;
  char *__s1;
  byte in_SIL;
  char *in_stack_00000018;
  char *string_value;
  string env_var;
  byte local_59;
  string local_30 [39];
  byte local_9;
  
  local_9 = in_SIL & 1;
  FlagToEnvVar_abi_cxx11_(in_stack_00000018);
  std::__cxx11::string::c_str();
  __s1 = posix::GetEnv((char *)0x171ce8);
  if (__s1 == (char *)0x0) {
    local_59 = local_9;
  }
  else {
    iVar1 = strcmp(__s1,"0");
    local_59 = iVar1 != 0;
  }
  std::__cxx11::string::~string(local_30);
  return (bool)(local_59 & 1);
}

Assistant:

bool BoolFromGTestEnv(const char* flag, bool default_value) {
#if defined(GTEST_GET_BOOL_FROM_ENV_)
  return GTEST_GET_BOOL_FROM_ENV_(flag, default_value);
#endif  // defined(GTEST_GET_BOOL_FROM_ENV_)
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  return string_value == NULL ?
      default_value : strcmp(string_value, "0") != 0;
}